

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_traceir(lua_State *L)

{
  byte bVar1;
  TValue *pTVar2;
  int32_t iVar3;
  uint uVar4;
  GCtrace *pGVar5;
  IRIns *pIVar6;
  int iVar7;
  int32_t m;
  IRIns *ir;
  IRRef ref;
  GCtrace *T;
  lua_State *L_local;
  
  pGVar5 = jit_checktrace(L);
  iVar3 = lj_lib_checkint(L,2);
  uVar4 = iVar3 + 0x8000;
  if (((pGVar5 == (GCtrace *)0x0) || (uVar4 < 0x8000)) || (pGVar5->nins <= uVar4)) {
    L_local._0_4_ = 0;
  }
  else {
    pIVar6 = pGVar5->ir + uVar4;
    bVar1 = lj_ir_mode[(pIVar6->field_1).o];
    L->top[-2].n = (double)bVar1;
    L->top[-1].n = (double)(pIVar6->field_0).ot;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    iVar7 = 0;
    if ((bVar1 & 3) == 0) {
      iVar7 = 0x8000;
    }
    pTVar2->n = (double)(int)((uint)(pIVar6->field_0).op1 - iVar7);
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    iVar7 = 0;
    if (((int)(uint)bVar1 >> 2 & 3U) == 0) {
      iVar7 = 0x8000;
    }
    pTVar2->n = (double)(int)((uint)(pIVar6->field_0).op2 - iVar7);
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)(pIVar6->field_0).prev;
    L_local._0_4_ = 5;
  }
  return (int)L_local;
}

Assistant:

LJLIB_CF(jit_util_traceir)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= REF_BIAS && ref < T->nins) {
    IRIns *ir = &T->ir[ref];
    int32_t m = lj_ir_mode[ir->o];
    setintV(L->top-2, m);
    setintV(L->top-1, ir->ot);
    setintV(L->top++, (int32_t)ir->op1 - (irm_op1(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, (int32_t)ir->op2 - (irm_op2(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, ir->prev);
    return 5;
  }
  return 0;
}